

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void leveldb::anon_unknown_35::CleanupIteratorState(void *arg1,void *arg2)

{
  long lVar1;
  void *in_RDI;
  long in_FS_OFFSET;
  IterState *state;
  Version *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  port::Mutex::Lock((Mutex *)in_stack_ffffffffffffffd8);
  MemTable::Unref((MemTable *)in_stack_ffffffffffffffd8);
  if (*(long *)((long)in_RDI + 0x18) != 0) {
    MemTable::Unref((MemTable *)in_stack_ffffffffffffffd8);
  }
  Version::Unref(in_stack_ffffffffffffffd8);
  port::Mutex::Unlock((Mutex *)in_stack_ffffffffffffffd8);
  if (in_RDI != (void *)0x0) {
    operator_delete(in_RDI,0x20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CleanupIteratorState(void* arg1, void* arg2) {
  IterState* state = reinterpret_cast<IterState*>(arg1);
  state->mu->Lock();
  state->mem->Unref();
  if (state->imm != nullptr) state->imm->Unref();
  state->version->Unref();
  state->mu->Unlock();
  delete state;
}